

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O0

void __thiscall InstructionGenerator::genDynamicGoto(InstructionGenerator *this)

{
  Variable local_48;
  Instruction local_14;
  InstructionGenerator *local_10;
  InstructionGenerator *this_local;
  
  local_14 = DYNAMIC_GOTO;
  local_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_14);
  VirtualStack::pop(&local_48,&this->super_VirtualStack);
  Variable::~Variable(&local_48);
  return;
}

Assistant:

void InstructionGenerator::genDynamicGoto()
{
    bytecode->emplace_back(Instruction::DYNAMIC_GOTO);
    pop();
}